

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::Locale::getDisplayLanguage(Locale *this,Locale *displayLocale,UnicodeString *result)

{
  ushort uVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  int32_t iVar4;
  int iVar5;
  UErrorCode errorCode;
  UErrorCode local_2c;
  
  local_2c = U_ZERO_ERROR;
  pcVar3 = UnicodeString::getBuffer(result,0x9d);
  if (pcVar3 != (char16_t *)0x0) {
    iVar4 = 0x1b;
    if (((result->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      iVar4 = (result->fUnion).fFields.fCapacity;
    }
    iVar2 = uloc_getDisplayLanguage_63
                      (this->fullName,displayLocale->fullName,pcVar3,iVar4,&local_2c);
    iVar4 = 0;
    if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar4 = iVar2;
    }
    UnicodeString::releaseBuffer(result,iVar4);
    if (local_2c != U_BUFFER_OVERFLOW_ERROR) {
      return result;
    }
    pcVar3 = UnicodeString::getBuffer(result,iVar2);
    if (pcVar3 != (char16_t *)0x0) {
      local_2c = U_ZERO_ERROR;
      iVar4 = 0x1b;
      if (((result->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
        iVar4 = (result->fUnion).fFields.fCapacity;
      }
      iVar2 = uloc_getDisplayLanguage_63
                        (this->fullName,displayLocale->fullName,pcVar3,iVar4,&local_2c);
      iVar4 = 0;
      if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar4 = iVar2;
      }
      UnicodeString::releaseBuffer(result,iVar4);
      return result;
    }
  }
  uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      iVar5 = (result->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)(short)uVar1 >> 5;
    }
    if (iVar5 != 0) {
      (result->fUnion).fStackFields.fLengthAndFlags = uVar1 & 0x1e;
    }
  }
  else {
    UnicodeString::unBogus(result);
  }
  return result;
}

Assistant:

UnicodeString&
Locale::getDisplayLanguage(const Locale &displayLocale,
                           UnicodeString &result) const {
    UChar *buffer;
    UErrorCode errorCode=U_ZERO_ERROR;
    int32_t length;

    buffer=result.getBuffer(ULOC_FULLNAME_CAPACITY);
    if(buffer==0) {
        result.truncate(0);
        return result;
    }

    length=uloc_getDisplayLanguage(fullName, displayLocale.fullName,
                                   buffer, result.getCapacity(),
                                   &errorCode);
    result.releaseBuffer(U_SUCCESS(errorCode) ? length : 0);

    if(errorCode==U_BUFFER_OVERFLOW_ERROR) {
        buffer=result.getBuffer(length);
        if(buffer==0) {
            result.truncate(0);
            return result;
        }
        errorCode=U_ZERO_ERROR;
        length=uloc_getDisplayLanguage(fullName, displayLocale.fullName,
                                       buffer, result.getCapacity(),
                                       &errorCode);
        result.releaseBuffer(U_SUCCESS(errorCode) ? length : 0);
    }

    return result;
}